

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O0

void __thiscall GlobOpt::GenerateLoopCount(GlobOpt *this,Loop *loop,LoopCount *loopCount)

{
  BailOutInfo *bailOutInfo_00;
  Instr *instr_00;
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  int iVar4;
  undefined4 *puVar5;
  StackSym *pSVar6;
  BailOutInstrTemplate<IR::Instr> *pBVar7;
  RegOpnd *pRVar8;
  Opnd *pOVar9;
  long lVar10;
  BailOutInstr *pBVar11;
  Instr *this_00;
  IntConstOpnd *newSrc;
  StackSym *local_90;
  Instr *instr_2;
  int minMagnitudeChange;
  BailOutInstr *instr_1;
  StackSym *leftSym;
  BailOutInstr *instr;
  StackSym *intermediateValueSym;
  StackSym *rightSym;
  IntConstOpnd *offset;
  Func *func;
  Instr *insertBeforeInstr;
  BailOutKind bailOutKind;
  BailOutInfo *bailOutInfo;
  LoopCount *loopCount_local;
  Loop *loop_local;
  GlobOpt *this_local;
  
  bVar2 = DoLoopCountBasedBoundCheckHoist(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x693,"(DoLoopCountBasedBoundCheckHoist())",
                       "DoLoopCountBasedBoundCheckHoist()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x694,"(loop)","loop");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (loopCount == (LoopCount *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x695,"(loopCount)","loopCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (loopCount != loop->loopCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x696,"(loopCount == loop->loopCount)","loopCount == loop->loopCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = LoopCount::HasBeenGenerated(loopCount);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x697,"(!loopCount->HasBeenGenerated())","!loopCount->HasBeenGenerated()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bailOutInfo_00 = loop->bailOutInfo;
  if (bailOutInfo_00 == (BailOutInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x69d,"(bailOutInfo)","bailOutInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  instr_00 = bailOutInfo_00->bailOutInstr;
  if (instr_00 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x6a0,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  func_00 = bailOutInfo_00->bailOutFunc;
  iVar4 = LoopCount::Offset(loopCount);
  if (iVar4 == 0) {
    local_90 = (StackSym *)0x0;
  }
  else {
    iVar4 = LoopCount::Offset(loopCount);
    local_90 = (StackSym *)IR::IntConstOpnd::New((long)iVar4,TyInt32,func_00,true);
  }
  rightSym = local_90;
  pSVar6 = LoopCount::RightSym(loopCount);
  if (pSVar6 == (StackSym *)0x0) {
    pSVar6 = LoopCount::LeftSym(loopCount);
    if (pSVar6 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x6cd,"(loopCount->LeftSym())","loopCount->LeftSym()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    instr = (BailOutInstr *)LoopCount::LeftSym(loopCount);
  }
  else {
    pBVar7 = IR::BailOutInstrTemplate<IR::Instr>::New
                       (Sub_I4,BailOutOnFailedHoistedLoopCountBasedBoundCheck,bailOutInfo_00,func_00
                       );
    IVar3 = StackSym::GetType(pSVar6);
    pRVar8 = IR::RegOpnd::New(pSVar6,IVar3,func_00);
    IR::Instr::SetSrc2(&pBVar7->super_Instr,&pRVar8->super_Opnd);
    pOVar9 = IR::Instr::GetSrc2(&pBVar7->super_Instr);
    IR::Opnd::SetIsJITOptimizedReg(pOVar9,true);
    pSVar6 = LoopCount::LeftSym(loopCount);
    if (pSVar6 == (StackSym *)0x0) {
      if (local_90 == (StackSym *)0x0) {
        (pBVar7->super_Instr).m_opcode = Neg_I4;
        pOVar9 = IR::Instr::UnlinkSrc2(&pBVar7->super_Instr);
        IR::Instr::SetSrc1(&pBVar7->super_Instr,pOVar9);
      }
      else {
        IR::Instr::SetSrc1(&pBVar7->super_Instr,(Opnd *)local_90);
        rightSym = (StackSym *)0x0;
      }
    }
    else {
      IVar3 = StackSym::GetType(pSVar6);
      pRVar8 = IR::RegOpnd::New(pSVar6,IVar3,func_00);
      IR::Instr::SetSrc1(&pBVar7->super_Instr,&pRVar8->super_Opnd);
      pOVar9 = IR::Instr::GetSrc1(&pBVar7->super_Instr);
      IR::Opnd::SetIsJITOptimizedReg(pOVar9,true);
    }
    instr = (BailOutInstr *)StackSym::New(TyInt32,func_00);
    IVar3 = StackSym::GetType((StackSym *)instr);
    pRVar8 = IR::RegOpnd::New((StackSym *)instr,IVar3,func_00);
    IR::Instr::SetDst(&pBVar7->super_Instr,&pRVar8->super_Opnd);
    pOVar9 = IR::Instr::GetDst(&pBVar7->super_Instr);
    IR::Opnd::SetIsJITOptimizedReg(pOVar9,true);
    IR::Instr::SetByteCodeOffset(&pBVar7->super_Instr,instr_00);
    IR::Instr::InsertBefore(instr_00,&pBVar7->super_Instr);
  }
  if (rightSym != (StackSym *)0x0) {
    pBVar7 = IR::BailOutInstrTemplate<IR::Instr>::New
                       (Add_I4,BailOutOnFailedHoistedLoopCountBasedBoundCheck,bailOutInfo_00,func_00
                       );
    IVar3 = StackSym::GetType((StackSym *)instr);
    pRVar8 = IR::RegOpnd::New((StackSym *)instr,IVar3,func_00);
    IR::Instr::SetSrc1(&pBVar7->super_Instr,&pRVar8->super_Opnd);
    pOVar9 = IR::Instr::GetSrc1(&pBVar7->super_Instr);
    IR::Opnd::SetIsJITOptimizedReg(pOVar9,true);
    lVar10 = IR::EncodableOpnd<long>::GetValue((EncodableOpnd<long> *)&(rightSym->super_Sym).m_id);
    if ((lVar10 < 0) &&
       (lVar10 = IR::EncodableOpnd<long>::GetValue
                           ((EncodableOpnd<long> *)&(rightSym->super_Sym).m_id),
       lVar10 != -0x80000000)) {
      (pBVar7->super_Instr).m_opcode = Sub_I4;
      lVar10 = IR::EncodableOpnd<long>::GetValue((EncodableOpnd<long> *)&(rightSym->super_Sym).m_id)
      ;
      IR::IntConstOpnd::SetValue((IntConstOpnd *)rightSym,-lVar10);
    }
    IR::Instr::SetSrc2(&pBVar7->super_Instr,(Opnd *)rightSym);
    pBVar11 = (BailOutInstr *)LoopCount::LeftSym(loopCount);
    if (instr == pBVar11) {
      instr = (BailOutInstr *)StackSym::New(TyInt32,func_00);
    }
    IVar3 = StackSym::GetType((StackSym *)instr);
    pRVar8 = IR::RegOpnd::New((StackSym *)instr,IVar3,func_00);
    IR::Instr::SetDst(&pBVar7->super_Instr,&pRVar8->super_Opnd);
    pOVar9 = IR::Instr::GetDst(&pBVar7->super_Instr);
    IR::Opnd::SetIsJITOptimizedReg(pOVar9,true);
    IR::Instr::SetByteCodeOffset(&pBVar7->super_Instr,instr_00);
    IR::Instr::InsertBefore(instr_00,&pBVar7->super_Instr);
  }
  iVar4 = LoopCount::MinMagnitudeChange(loopCount);
  if (iVar4 == 1) {
    pBVar11 = (BailOutInstr *)LoopCount::LeftSym(loopCount);
    if (instr == pBVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x703,"(intermediateValueSym != loopCount->LeftSym())",
                         "intermediateValueSym != loopCount->LeftSym()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  else {
    this_00 = IR::Instr::New(Div_I4,func_00);
    IVar3 = StackSym::GetType((StackSym *)instr);
    pRVar8 = IR::RegOpnd::New((StackSym *)instr,IVar3,func_00);
    IR::Instr::SetSrc1(this_00,&pRVar8->super_Opnd);
    pOVar9 = IR::Instr::GetSrc1(this_00);
    IR::Opnd::SetIsJITOptimizedReg(pOVar9,true);
    if (iVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x6f4,"(minMagnitudeChange != 0)","minMagnitudeChange != 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    newSrc = IR::IntConstOpnd::New((long)iVar4,TyInt32,func_00,true);
    IR::Instr::SetSrc2(this_00,&newSrc->super_Opnd);
    pBVar11 = (BailOutInstr *)LoopCount::LeftSym(loopCount);
    if (instr == pBVar11) {
      instr = (BailOutInstr *)StackSym::New(TyInt32,func_00);
    }
    IVar3 = StackSym::GetType((StackSym *)instr);
    pRVar8 = IR::RegOpnd::New((StackSym *)instr,IVar3,func_00);
    IR::Instr::SetDst(this_00,&pRVar8->super_Opnd);
    pOVar9 = IR::Instr::GetDst(this_00);
    IR::Opnd::SetIsJITOptimizedReg(pOVar9,true);
    IR::Instr::SetByteCodeOffset(this_00,instr_00);
    IR::Instr::InsertBefore(instr_00,this_00);
  }
  LoopCount::SetLoopCountMinusOneSym(loopCount,(StackSym *)instr);
  return;
}

Assistant:

void GlobOpt::GenerateLoopCount(Loop *const loop, LoopCount *const loopCount)
{
    Assert(DoLoopCountBasedBoundCheckHoist());
    Assert(loop);
    Assert(loopCount);
    Assert(loopCount == loop->loopCount);
    Assert(!loopCount->HasBeenGenerated());

    // loopCountMinusOne = (left - right + offset) / minMagnitudeChange

    // Prepare the landing pad for bailouts and instruction insertion
    BailOutInfo *const bailOutInfo = loop->bailOutInfo;
    Assert(bailOutInfo);
    const IR::BailOutKind bailOutKind = IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck;
    IR::Instr *const insertBeforeInstr = bailOutInfo->bailOutInstr;
    Assert(insertBeforeInstr);
    Func *const func = bailOutInfo->bailOutFunc;

    // intermediateValue = left - right
    IR::IntConstOpnd *offset =
        loopCount->Offset() == 0 ? nullptr : IR::IntConstOpnd::New(loopCount->Offset(), TyInt32, func, true);
    StackSym *const rightSym = loopCount->RightSym();
    StackSym *intermediateValueSym;
    if(rightSym)
    {
        IR::BailOutInstr *const instr = IR::BailOutInstr::New(Js::OpCode::Sub_I4, bailOutKind, bailOutInfo, func);

        instr->SetSrc2(IR::RegOpnd::New(rightSym, rightSym->GetType(), func));
        instr->GetSrc2()->SetIsJITOptimizedReg(true);

        StackSym *const leftSym = loopCount->LeftSym();
        if(leftSym)
        {
            // intermediateValue = left - right
            instr->SetSrc1(IR::RegOpnd::New(leftSym, leftSym->GetType(), func));
            instr->GetSrc1()->SetIsJITOptimizedReg(true);
        }
        else if(offset)
        {
            // intermediateValue = offset - right
            instr->SetSrc1(offset);
            offset = nullptr;
        }
        else
        {
            // intermediateValue = -right
            instr->m_opcode = Js::OpCode::Neg_I4;
            instr->SetSrc1(instr->UnlinkSrc2());
        }

        intermediateValueSym = StackSym::New(TyInt32, func);
        instr->SetDst(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetDst()->SetIsJITOptimizedReg(true);

        instr->SetByteCodeOffset(insertBeforeInstr);
        insertBeforeInstr->InsertBefore(instr);
    }
    else
    {
        // intermediateValue = left
        Assert(loopCount->LeftSym());
        intermediateValueSym = loopCount->LeftSym();
    }

    // intermediateValue += offset
    if(offset)
    {
        IR::BailOutInstr *const instr = IR::BailOutInstr::New(Js::OpCode::Add_I4, bailOutKind, bailOutInfo, func);

        instr->SetSrc1(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetSrc1()->SetIsJITOptimizedReg(true);

        if(offset->GetValue() < 0 && offset->GetValue() != IntConstMin)
        {
            instr->m_opcode = Js::OpCode::Sub_I4;
            offset->SetValue(-offset->GetValue());
        }
        instr->SetSrc2(offset);

        if(intermediateValueSym == loopCount->LeftSym())
        {
            intermediateValueSym = StackSym::New(TyInt32, func);
        }
        instr->SetDst(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetDst()->SetIsJITOptimizedReg(true);

        instr->SetByteCodeOffset(insertBeforeInstr);
        insertBeforeInstr->InsertBefore(instr);
    }

    // intermediateValue /= minMagnitudeChange
    const int minMagnitudeChange = loopCount->MinMagnitudeChange();
    if(minMagnitudeChange != 1)
    {
        IR::Instr *const instr = IR::Instr::New(Js::OpCode::Div_I4, func);

        instr->SetSrc1(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetSrc1()->SetIsJITOptimizedReg(true);

        Assert(minMagnitudeChange != 0); // bailout is not needed
        instr->SetSrc2(IR::IntConstOpnd::New(minMagnitudeChange, TyInt32, func, true));

        if(intermediateValueSym == loopCount->LeftSym())
        {
            intermediateValueSym = StackSym::New(TyInt32, func);
        }
        instr->SetDst(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetDst()->SetIsJITOptimizedReg(true);

        instr->SetByteCodeOffset(insertBeforeInstr);
        insertBeforeInstr->InsertBefore(instr);
    }
    else
    {
        Assert(intermediateValueSym != loopCount->LeftSym());
    }

    // loopCountMinusOne = intermediateValue
    loopCount->SetLoopCountMinusOneSym(intermediateValueSym);
}